

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O3

void getPixelColorRGBA16(unsigned_short *r,unsigned_short *g,unsigned_short *b,unsigned_short *a,
                        uchar *in,size_t i,LodePNGColorMode *mode)

{
  undefined2 uVar1;
  long lVar2;
  unsigned_short uVar3;
  ushort uVar4;
  
  switch(mode->colortype) {
  case LCT_GREY:
    uVar3 = CONCAT11(in[i * 2],in[i * 2 + 1]);
    *b = uVar3;
    *g = uVar3;
    *r = uVar3;
    if ((mode->key_defined == 0) || ((uint)CONCAT11(in[i * 2],in[i * 2 + 1]) != mode->key_r))
    goto LAB_0034f109;
LAB_0034f06c:
    uVar3 = 0;
    break;
  default:
    goto switchD_0034f021_caseD_1;
  case LCT_RGB:
    lVar2 = i * 6;
    *r = CONCAT11(in[lVar2],in[lVar2 + 1]);
    uVar3 = swap_bytes(*(undefined2 *)(in + lVar2 + 2));
    *g = uVar3;
    uVar3 = swap_bytes(*(undefined2 *)(in + lVar2 + 4));
    *b = uVar3;
    if ((((mode->key_defined != 0) && ((uint)CONCAT11(in[lVar2],in[i * 6 + 1]) == mode->key_r)) &&
        (uVar4 = swap_bytes(*(undefined2 *)(in + lVar2 + 2)), (uint)uVar4 == mode->key_g)) &&
       (uVar4 = swap_bytes(*(undefined2 *)(in + lVar2 + 4)), (uint)uVar4 == mode->key_b))
    goto LAB_0034f06c;
LAB_0034f109:
    uVar3 = 0xffff;
    break;
  case LCT_GREY_ALPHA:
    uVar1 = *(undefined2 *)(in + i * 4);
    uVar3 = swap_bytes(uVar1);
    *b = uVar3;
    uVar3 = swap_bytes(uVar1);
    *g = uVar3;
    uVar3 = swap_bytes(uVar1);
    *r = uVar3;
    uVar3 = swap_bytes(*(undefined2 *)(in + i * 4 + 2));
    break;
  case LCT_RGBA:
    uVar3 = swap_bytes(*(undefined2 *)(in + i * 8));
    *r = uVar3;
    uVar3 = swap_bytes(*(undefined2 *)(in + i * 8 + 2));
    *g = uVar3;
    uVar3 = swap_bytes(*(undefined2 *)(in + i * 8 + 4));
    *b = uVar3;
    uVar3 = swap_bytes(*(undefined2 *)(in + i * 8 + 6));
  }
  *a = uVar3;
switchD_0034f021_caseD_1:
  return;
}

Assistant:

static void getPixelColorRGBA16(unsigned short* r, unsigned short* g, unsigned short* b, unsigned short* a,
                                const unsigned char* in, size_t i, const LodePNGColorMode* mode)
{
  if(mode->colortype == LCT_GREY)
  {
    *r = *g = *b = 256 * in[i * 2 + 0] + in[i * 2 + 1];
    if(mode->key_defined && 256U * in[i * 2 + 0] + in[i * 2 + 1] == mode->key_r) *a = 0;
    else *a = 65535;
  }
  else if(mode->colortype == LCT_RGB)
  {
    *r = 256u * in[i * 6 + 0] + in[i * 6 + 1];
    *g = 256u * in[i * 6 + 2] + in[i * 6 + 3];
    *b = 256u * in[i * 6 + 4] + in[i * 6 + 5];
    if(mode->key_defined
       && 256u * in[i * 6 + 0] + in[i * 6 + 1] == mode->key_r
       && 256u * in[i * 6 + 2] + in[i * 6 + 3] == mode->key_g
       && 256u * in[i * 6 + 4] + in[i * 6 + 5] == mode->key_b) *a = 0;
    else *a = 65535;
  }
  else if(mode->colortype == LCT_GREY_ALPHA)
  {
    *r = *g = *b = 256u * in[i * 4 + 0] + in[i * 4 + 1];
    *a = 256u * in[i * 4 + 2] + in[i * 4 + 3];
  }
  else if(mode->colortype == LCT_RGBA)
  {
    *r = 256u * in[i * 8 + 0] + in[i * 8 + 1];
    *g = 256u * in[i * 8 + 2] + in[i * 8 + 3];
    *b = 256u * in[i * 8 + 4] + in[i * 8 + 5];
    *a = 256u * in[i * 8 + 6] + in[i * 8 + 7];
  }
}